

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

void fetchTransformedBilinearARGB32PM_upscale_helper<(TextureBlendType)4>
               (uint *b,uint *end,QTextureData *image,int *fx,int *fy,int fdx,int param_7)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uchar *puVar5;
  uchar *puVar6;
  uint **ppuVar7;
  uint *in_RCX;
  QTextureData *in_RDX;
  uint *in_RSI;
  uint *in_RDI;
  uint *in_R8;
  int in_R9D;
  long in_FS_OFFSET;
  int distx_1;
  uint br;
  uint bl;
  uint tr;
  uint tl;
  int distx;
  int x;
  uint bot;
  uint top;
  qint64 max_fx;
  qint64 min_fx;
  int disty;
  uint *s2;
  uint *s1;
  int x2_1;
  int x1_1;
  uint *boundedEnd;
  int x2;
  int x1;
  int y2;
  int y1;
  uint in_stack_ffffffffffffff58;
  uint in_stack_ffffffffffffff5c;
  uint in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff64;
  uint in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff6c;
  uint *local_40;
  int local_38;
  int local_34;
  uint *local_30;
  uint *local_28;
  uint *local_20;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = (int)*in_R8 >> 0x10;
  local_10 = -0x55555556;
  fetchTransformedBilinear_pixelBounds<(TextureBlendType)4>
            (in_RDX->height,in_RDX->y1,in_RDX->y2 + -1,&local_c,&local_10);
  puVar5 = QTextureData::scanLine(in_RDX,local_c);
  puVar6 = QTextureData::scanLine(in_RDX,local_10);
  uVar3 = (int)(*in_R8 & 0xffff) >> 8;
  iVar1 = in_RDX->x1;
  iVar2 = in_RDX->x2;
  for (local_40 = in_RDI; local_40 < in_RSI; local_40 = local_40 + 1) {
    local_14 = (int)*in_RCX >> 0x10;
    local_18 = -0x55555556;
    fetchTransformedBilinear_pixelBounds<(TextureBlendType)4>
              (in_RDX->width,in_RDX->x1,in_RDX->x2 + -1,&local_14,&local_18);
    if (local_14 != local_18) break;
    in_stack_ffffffffffffff6c = *(uint *)(puVar5 + (long)local_14 * 4);
    in_stack_ffffffffffffff68 = *(uint *)(puVar6 + (long)local_14 * 4);
    uVar4 = INTERPOLATE_PIXEL_256
                      (in_stack_ffffffffffffff6c,0x100 - uVar3,in_stack_ffffffffffffff68,uVar3);
    *local_40 = uVar4;
    *in_RCX = in_R9D + *in_RCX;
  }
  if (in_R9D < 1) {
    local_20 = in_RSI;
    if (in_R9D < 0) {
      local_30 = local_40 + ((long)iVar1 * 0x10000 - (long)(int)*in_RCX) / (long)in_R9D;
      ppuVar7 = qMin<unsigned_int*>(&local_20,&local_30);
      local_20 = *ppuVar7;
    }
  }
  else {
    local_28 = local_40 + ((long)(iVar2 + -1) * 0x10000 - (long)(int)*in_RCX) / (long)in_R9D;
    ppuVar7 = qMin<unsigned_int*>(&local_20,&local_28);
    local_20 = *ppuVar7;
  }
  for (; local_40 < local_20; local_40 = local_40 + 1) {
    in_stack_ffffffffffffff64 = (int)*in_RCX >> 0x10;
    in_stack_ffffffffffffff60 = (int)(*in_RCX & 0xffff) >> 8;
    uVar3 = interpolate_4_pixels
                      ((uint *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                       (uint *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                       in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
    *local_40 = uVar3;
    *in_RCX = in_R9D + *in_RCX;
  }
  for (; local_40 < in_RSI; local_40 = local_40 + 1) {
    local_34 = (int)*in_RCX >> 0x10;
    local_38 = -0x55555556;
    fetchTransformedBilinear_pixelBounds<(TextureBlendType)4>
              (in_RDX->width,in_RDX->x1,in_RDX->x2 + -1,&local_34,&local_38);
    uVar3 = interpolate_4_pixels
                      (in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64
                       ,in_stack_ffffffffffffff60,*(uint *)(puVar5 + (long)local_34 * 4),
                       *(uint *)(puVar5 + (long)local_38 * 4));
    *local_40 = uVar3;
    *in_RCX = in_R9D + *in_RCX;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void QT_FASTCALL fetchTransformedBilinearARGB32PM_upscale_helper(uint *b, uint *end, const QTextureData &image,
                                                                        int &fx, int &fy, int fdx, int /*fdy*/)
{
    int y1 = (fy >> 16);
    int y2;
    fetchTransformedBilinear_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, y1, y2);
    const uint *s1 = (const uint *)image.scanLine(y1);
    const uint *s2 = (const uint *)image.scanLine(y2);
    const int disty = (fy & 0x0000ffff) >> 8;

    if (blendType != BlendTransformedBilinearTiled) {
        const qint64 min_fx = qint64(image.x1) * fixed_scale;
        const qint64 max_fx = qint64(image.x2 - 1) * fixed_scale;
        while (b < end) {
            int x1 = (fx >> 16);
            int x2;
            fetchTransformedBilinear_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, x1, x2);
            if (x1 != x2)
                break;
            uint top = s1[x1];
            uint bot = s2[x1];
            *b = INTERPOLATE_PIXEL_256(top, 256 - disty, bot, disty);
            fx += fdx;
            ++b;
        }
        uint *boundedEnd = end;
        if (fdx > 0)
            boundedEnd = qMin(boundedEnd, b + (max_fx - fx) / fdx);
        else if (fdx < 0)
            boundedEnd = qMin(boundedEnd, b + (min_fx - fx) / fdx);

        // A fast middle part without boundary checks
        while (b < boundedEnd) {
            int x = (fx >> 16);
            int distx = (fx & 0x0000ffff) >> 8;
            *b = interpolate_4_pixels(s1 + x, s2 + x, distx, disty);
            fx += fdx;
            ++b;
        }
    }

    while (b < end) {
        int x1 = (fx >> 16);
        int x2;
        fetchTransformedBilinear_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1 , x1, x2);
        uint tl = s1[x1];
        uint tr = s1[x2];
        uint bl = s2[x1];
        uint br = s2[x2];
        int distx = (fx & 0x0000ffff) >> 8;
        *b = interpolate_4_pixels(tl, tr, bl, br, distx, disty);

        fx += fdx;
        ++b;
    }
}